

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

void __thiscall FIX::Dictionary::Dictionary(Dictionary *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_002f3dc0;
  p_Var1 = &(this->m_data)._M_t._M_impl.super__Rb_tree_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Dictionary() {}